

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2Reference(void *ctx,xmlChar *name)

{
  xmlNodePtr node;
  
  if (ctx == (void *)0x0) {
    return;
  }
  node = xmlNewReference(*(xmlDoc **)((long)ctx + 0x10),name);
  if (node != (xmlNodePtr)0x0) {
    xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,node);
    return;
  }
  xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  return;
}

Assistant:

void
xmlSAX2Reference(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;
    ret = xmlNewReference(ctxt->myDoc, name);
    if (ret == NULL) {
        xmlSAX2ErrMemory(ctxt);
        return;
    }

    xmlSAX2AppendChild(ctxt, ret);
}